

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O2

size_t WebRtc_available_read(RingBuffer *self)

{
  if (self == (RingBuffer *)0x0) {
    return 0;
  }
  if (self->rw_wrap != SAME_WRAP) {
    return (self->element_count - self->read_pos) + self->write_pos;
  }
  return self->write_pos - self->read_pos;
}

Assistant:

size_t WebRtc_available_read(const RingBuffer* self) {
  if (!self) {
    return 0;
  }

  if (self->rw_wrap == SAME_WRAP) {
    return self->write_pos - self->read_pos;
  } else {
    return self->element_count - self->read_pos + self->write_pos;
  }
}